

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.h
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::~ChElementShellANCF_3833
          (ChElementShellANCF_3833 *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       pp_Var1;
  this->super_ChLoadableUV = *(ChLoadableUV *)(vtt + 5);
  *(void **)(pp_Var1[-3] +
            (long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                   _vptr_ChElementBase) = vtt[6];
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 7);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_K13Compact);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_K3Compact);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_O2);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_O1);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_kGQ);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->m_SD);
  std::_Vector_base<double,_Eigen::aligned_allocator<double>_>::~_Vector_base
            (&(this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>
            );
  std::
  vector<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
  ::~vector(&this->m_layers);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
  ::~vector(&this->m_nodes);
  ChElementGeneric::~ChElementGeneric((ChElementGeneric *)this);
  return;
}

Assistant:

~ChElementShellANCF_3833() {}